

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O0

int main(int argc,char **argv)

{
  GLboolean GVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  uint local_5c;
  int local_58;
  GLint strategy_1;
  int robustness;
  int profile_1;
  GLFWwindow *window;
  uint local_40;
  GLint mask;
  GLint flags;
  GLboolean list;
  GLboolean forward;
  uint uStack_34;
  GLboolean debug;
  int revision;
  int minor;
  int major;
  int behavior;
  int strategy;
  int profile;
  int api;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  strategy = 0;
  behavior = 0;
  major = 0;
  minor = 0;
  revision = 1;
  uStack_34 = 0;
  mask._3_1_ = '\0';
  mask._2_1_ = '\0';
  mask._1_1_ = '\0';
  _api = argv;
  argv_local._0_4_ = argc;
  while (profile = getopt((int)argv_local,_api,"a:b:dfhlm:n:p:s:"), profile != -1) {
    switch(profile) {
    case 0x61:
      iVar2 = strcasecmp(optarg,"gl");
      if (iVar2 == 0) {
        strategy = 0x30001;
      }
      else {
        iVar2 = strcasecmp(optarg,"es");
        if (iVar2 != 0) {
          usage();
          exit(1);
        }
        strategy = 0x30002;
      }
      break;
    case 0x62:
      iVar2 = strcasecmp(optarg,"none");
      if (iVar2 == 0) {
        minor = 0x35002;
      }
      else {
        iVar2 = strcasecmp(optarg,"flush");
        if (iVar2 != 0) {
          usage();
          exit(1);
        }
        minor = 0x35001;
      }
      break;
    default:
      usage();
      exit(1);
    case 100:
      mask._3_1_ = '\x01';
      break;
    case 0x66:
      mask._2_1_ = '\x01';
      break;
    case 0x68:
      usage();
      exit(0);
    case 0x6c:
      mask._1_1_ = '\x01';
      break;
    case 0x6d:
      revision = atoi(optarg);
      break;
    case 0x6e:
      uStack_34 = atoi(optarg);
      break;
    case 0x70:
      iVar2 = strcasecmp(optarg,"core");
      if (iVar2 == 0) {
        behavior = 0x32001;
      }
      else {
        iVar2 = strcasecmp(optarg,"compat");
        if (iVar2 != 0) {
          usage();
          exit(1);
        }
        behavior = 0x32002;
      }
      break;
    case 0x73:
      iVar2 = strcasecmp(optarg,"none");
      if (iVar2 == 0) {
        major = 0x31001;
      }
      else {
        iVar2 = strcasecmp(optarg,"lose");
        if (iVar2 != 0) {
          usage();
          exit(1);
        }
        major = 0x31002;
      }
    }
  }
  GVar1 = valid_version();
  if (GVar1 == '\0') {
    exit(1);
  }
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    exit(1);
  }
  if ((revision != 1) || (uStack_34 != 0)) {
    glfwWindowHint(0x22002,revision);
    glfwWindowHint(0x22003,uStack_34);
  }
  if (strategy != 0) {
    glfwWindowHint(0x22001,strategy);
  }
  if (mask._3_1_ != '\0') {
    glfwWindowHint(0x22007,1);
  }
  if (mask._2_1_ != '\0') {
    glfwWindowHint(0x22006,1);
  }
  if (behavior != 0) {
    glfwWindowHint(0x22008,behavior);
  }
  if (major != 0) {
    glfwWindowHint(0x22005,major);
  }
  if (minor != 0) {
    glfwWindowHint(0x22009,minor);
  }
  glfwWindowHint(0x21001,-1);
  glfwWindowHint(0x21002,-1);
  glfwWindowHint(0x21003,-1);
  glfwWindowHint(0x21004,-1);
  glfwWindowHint(0x21005,-1);
  glfwWindowHint(0x21006,-1);
  glfwWindowHint(0x21007,-1);
  glfwWindowHint(0x21008,-1);
  glfwWindowHint(0x21009,-1);
  glfwWindowHint(0x2100a,-1);
  glfwWindowHint(0x2100b,-1);
  glfwWindowHint(0x2100d,-1);
  glfwWindowHint(0x2100e,-1);
  glfwWindowHint(0x20004,0);
  _robustness = glfwCreateWindow(200,200,"Version",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (_robustness == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwMakeContextCurrent(_robustness);
  strategy = glfwGetWindowAttrib(_robustness,0x22001);
  revision = glfwGetWindowAttrib(_robustness,0x22002);
  uStack_34 = glfwGetWindowAttrib(_robustness,0x22003);
  flags = glfwGetWindowAttrib(_robustness,0x22004);
  pcVar3 = get_client_api_name(strategy);
  uVar4 = glGetString(0x1f02);
  printf("%s context version string: \"%s\"\n",pcVar3,uVar4);
  pcVar3 = get_client_api_name(strategy);
  printf("%s context version parsed by GLFW: %u.%u.%u\n",pcVar3,(ulong)(uint)revision,
         (ulong)uStack_34,(ulong)(uint)flags);
  if (strategy == 0x30001) {
    if (2 < revision) {
      glGetIntegerv(0x821e,&local_40);
      pcVar3 = get_client_api_name(strategy);
      printf("%s context flags (0x%08x):",pcVar3,(ulong)local_40);
      if ((local_40 & 1) != 0) {
        printf(" forward-compatible");
      }
      if ((local_40 & 2) != 0) {
        printf(" debug");
      }
      if ((local_40 & 4) != 0) {
        printf(" robustness");
      }
      putchar(10);
      pcVar3 = get_client_api_name(strategy);
      printf("%s context flags parsed by GLFW:",pcVar3);
      iVar2 = glfwGetWindowAttrib(_robustness,0x22006);
      if (iVar2 != 0) {
        printf(" forward-compatible");
      }
      iVar2 = glfwGetWindowAttrib(_robustness,0x22007);
      if (iVar2 != 0) {
        printf(" debug");
      }
      iVar2 = glfwGetWindowAttrib(_robustness,0x22005);
      if (iVar2 != 0) {
        printf(" robustness");
      }
      putchar(10);
    }
    if ((3 < revision) || ((revision == 3 && (1 < (int)uStack_34)))) {
      strategy_1 = glfwGetWindowAttrib(_robustness,0x22008);
      glGetIntegerv(0x9126,(long)&window + 4);
      pcVar3 = get_client_api_name(strategy);
      pcVar5 = get_profile_name_gl(window._4_4_);
      printf("%s profile mask (0x%08x): %s\n",pcVar3,(ulong)window._4_4_,pcVar5);
      pcVar3 = get_client_api_name(strategy);
      pcVar5 = get_profile_name_glfw(strategy_1);
      printf("%s profile mask parsed by GLFW: %s\n",pcVar3,pcVar5);
    }
    iVar2 = glfwExtensionSupported("GL_ARB_robustness");
    if (iVar2 != 0) {
      glGetIntegerv(0x8256,&local_5c);
      pcVar3 = get_client_api_name(strategy);
      pcVar5 = get_strategy_name_gl(local_5c);
      printf("%s robustness strategy (0x%08x): %s\n",pcVar3,(ulong)local_5c,pcVar5);
      local_58 = glfwGetWindowAttrib(_robustness,0x22005);
      pcVar3 = get_client_api_name(strategy);
      pcVar5 = get_strategy_name_glfw(local_58);
      printf("%s robustness strategy parsed by GLFW: %s\n",pcVar3,pcVar5);
    }
  }
  pcVar3 = get_client_api_name(strategy);
  uVar4 = glGetString(0x1f01);
  printf("%s context renderer string: \"%s\"\n",pcVar3,uVar4);
  pcVar3 = get_client_api_name(strategy);
  uVar4 = glGetString(0x1f00);
  printf("%s context vendor string: \"%s\"\n",pcVar3,uVar4);
  if (1 < revision) {
    pcVar3 = get_client_api_name(strategy);
    uVar4 = glGetString(0x8b8c);
    printf("%s context shading language version: \"%s\"\n",pcVar3,uVar4);
  }
  if (mask._1_1_ != '\0') {
    list_extensions(strategy,revision,uStack_34);
  }
  glfwTerminate();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, api = 0, profile = 0, strategy = 0, behavior = 0, major = 1, minor = 0, revision;
    GLboolean debug = GL_FALSE, forward = GL_FALSE, list = GL_FALSE;
    GLint flags, mask;
    GLFWwindow* window;

    while ((ch = getopt(argc, argv, "a:b:dfhlm:n:p:s:")) != -1)
    {
        switch (ch)
        {
            case 'a':
                if (strcasecmp(optarg, API_OPENGL) == 0)
                    api = GLFW_OPENGL_API;
                else if (strcasecmp(optarg, API_OPENGL_ES) == 0)
                    api = GLFW_OPENGL_ES_API;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'b':
                if (strcasecmp(optarg, BEHAVIOR_NAME_NONE) == 0)
                    behavior = GLFW_RELEASE_BEHAVIOR_NONE;
                else if (strcasecmp(optarg, BEHAVIOR_NAME_FLUSH) == 0)
                    behavior = GLFW_RELEASE_BEHAVIOR_FLUSH;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'd':
                debug = GL_TRUE;
                break;
            case 'f':
                forward = GL_TRUE;
                break;
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 'l':
                list = GL_TRUE;
                break;
            case 'm':
                major = atoi(optarg);
                break;
            case 'n':
                minor = atoi(optarg);
                break;
            case 'p':
                if (strcasecmp(optarg, PROFILE_NAME_CORE) == 0)
                    profile = GLFW_OPENGL_CORE_PROFILE;
                else if (strcasecmp(optarg, PROFILE_NAME_COMPAT) == 0)
                    profile = GLFW_OPENGL_COMPAT_PROFILE;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 's':
                if (strcasecmp(optarg, STRATEGY_NAME_NONE) == 0)
                    strategy = GLFW_NO_RESET_NOTIFICATION;
                else if (strcasecmp(optarg, STRATEGY_NAME_LOSE) == 0)
                    strategy = GLFW_LOSE_CONTEXT_ON_RESET;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    // Initialize GLFW and create window

    if (!valid_version())
        exit(EXIT_FAILURE);

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (major != 1 || minor != 0)
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, major);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, minor);
    }

    if (api != 0)
        glfwWindowHint(GLFW_CLIENT_API, api);

    if (debug)
        glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    if (forward)
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);

    if (profile != 0)
        glfwWindowHint(GLFW_OPENGL_PROFILE, profile);

    if (strategy)
        glfwWindowHint(GLFW_CONTEXT_ROBUSTNESS, strategy);

    if (behavior)
        glfwWindowHint(GLFW_CONTEXT_RELEASE_BEHAVIOR, behavior);

    glfwWindowHint(GLFW_RED_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_GREEN_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_BLUE_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ALPHA_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_DEPTH_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_STENCIL_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_RED_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_GREEN_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_BLUE_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_ALPHA_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_AUX_BUFFERS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_SAMPLES, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_SRGB_CAPABLE, GLFW_DONT_CARE);

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    window = glfwCreateWindow(200, 200, "Version", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);

    // Report client API version

    api = glfwGetWindowAttrib(window, GLFW_CLIENT_API);
    major = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MAJOR);
    minor = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MINOR);
    revision = glfwGetWindowAttrib(window, GLFW_CONTEXT_REVISION);

    printf("%s context version string: \"%s\"\n",
           get_client_api_name(api),
           glGetString(GL_VERSION));

    printf("%s context version parsed by GLFW: %u.%u.%u\n",
           get_client_api_name(api),
           major, minor, revision);

    // Report client API context properties

    if (api == GLFW_OPENGL_API)
    {
        if (major >= 3)
        {
            glGetIntegerv(GL_CONTEXT_FLAGS, &flags);
            printf("%s context flags (0x%08x):", get_client_api_name(api), flags);

            if (flags & GL_CONTEXT_FLAG_FORWARD_COMPATIBLE_BIT)
                printf(" forward-compatible");
            if (flags & GL_CONTEXT_FLAG_DEBUG_BIT)
                printf(" debug");
            if (flags & GL_CONTEXT_FLAG_ROBUST_ACCESS_BIT_ARB)
                printf(" robustness");
            putchar('\n');

            printf("%s context flags parsed by GLFW:", get_client_api_name(api));

            if (glfwGetWindowAttrib(window, GLFW_OPENGL_FORWARD_COMPAT))
                printf(" forward-compatible");
            if (glfwGetWindowAttrib(window, GLFW_OPENGL_DEBUG_CONTEXT))
                printf(" debug");
            if (glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS) != GLFW_NO_ROBUSTNESS)
                printf(" robustness");
            putchar('\n');
        }

        if (major > 3 || (major == 3 && minor >= 2))
        {
            int profile = glfwGetWindowAttrib(window, GLFW_OPENGL_PROFILE);

            glGetIntegerv(GL_CONTEXT_PROFILE_MASK, &mask);
            printf("%s profile mask (0x%08x): %s\n",
                   get_client_api_name(api),
                   mask,
                   get_profile_name_gl(mask));

            printf("%s profile mask parsed by GLFW: %s\n",
                   get_client_api_name(api),
                   get_profile_name_glfw(profile));
        }

        if (glfwExtensionSupported("GL_ARB_robustness"))
        {
            int robustness;
            GLint strategy;
            glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY_ARB, &strategy);

            printf("%s robustness strategy (0x%08x): %s\n",
                   get_client_api_name(api),
                   strategy,
                   get_strategy_name_gl(strategy));

            robustness = glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS);

            printf("%s robustness strategy parsed by GLFW: %s\n",
                   get_client_api_name(api),
                   get_strategy_name_glfw(robustness));
        }
    }

    printf("%s context renderer string: \"%s\"\n",
           get_client_api_name(api),
           glGetString(GL_RENDERER));
    printf("%s context vendor string: \"%s\"\n",
           get_client_api_name(api),
           glGetString(GL_VENDOR));

    if (major > 1)
    {
        printf("%s context shading language version: \"%s\"\n",
               get_client_api_name(api),
               glGetString(GL_SHADING_LANGUAGE_VERSION));
    }

    // Report client API extensions
    if (list)
        list_extensions(api, major, minor);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}